

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopll.c
# Opt level: O3

void nukedopll_reset_chip(void *chipptr)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  long lVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  long lVar6;
  
  uVar1 = *chipptr;
  lVar3 = 0;
  uVar4 = 0;
  do {
    uVar4 = uVar4 | *(int *)((long)chipptr + lVar3 * 4 + 0x198) << ((byte)lVar3 & 0x1f);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0xe);
  NOPLL_Reset((opll_t *)chipptr,*(uint32_t *)((long)chipptr + 0x10),
              *(uint32_t *)((long)chipptr + 0xc),*(uint32_t *)((long)chipptr + 8));
  *(undefined8 *)chipptr = uVar1;
  auVar2 = _DAT_00172610;
  lVar3 = 0;
  auVar5 = _DAT_00172600;
  do {
    if (SUB164(auVar5 ^ auVar2,4) == -0x80000000 && SUB164(auVar5 ^ auVar2,0) < -0x7ffffff2) {
      *(uint *)((long)chipptr + lVar3 * 4 + 0x198) =
           (uint)((uVar4 >> ((uint)lVar3 & 0x1f) & 1) != 0);
      *(uint *)((long)chipptr + lVar3 * 4 + 0x19c) =
           (uint)((uVar4 >> ((uint)lVar3 + 1 & 0x1f) & 1) != 0);
    }
    lVar3 = lVar3 + 2;
    lVar6 = auVar5._8_8_;
    auVar5._0_8_ = auVar5._0_8_ + 2;
    auVar5._8_8_ = lVar6 + 2;
  } while (lVar3 != 0xe);
  return;
}

Assistant:

static void nukedopll_reset_chip(void *chipptr)
{
	opll_t *chip = (opll_t *)chipptr;
	UINT8 chn;
	DEV_DATA devData;
	UINT32 mute;
	
	devData = chip->_devData;
	mute = 0;
	for (chn = 0; chn < 14; chn ++)
		mute |= (chip->mute[chn] << chn);
	
	NOPLL_Reset(chip, chip->chip_type, chip->smplRate, chip->clock);
	
	chip->_devData = devData;
	for (chn = 0; chn < 14; chn ++)
		chip->mute[chn] = (mute >> chn) & 0x01;
	
	return;
}